

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  function<bool_(std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)> *pfVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  bool bVar5;
  long lVar6;
  pointer pFVar7;
  ostream *poVar8;
  undefined8 extraout_RAX;
  uint uVar9;
  Facet *f;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  double dVar16;
  double dVar17;
  Extent domain;
  vector<double,_std::allocator<double>_> dist;
  PriorityQueue process;
  string filename;
  STL stl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  DistanceTree tree;
  ImportedUgrid ugrid;
  undefined1 *apuStack_450 [2];
  ulong local_440;
  CurrentState local_438;
  vector<double,_std::allocator<double>_> local_3f0;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  local_3d8;
  string local_3b0;
  undefined8 local_390;
  undefined8 local_388;
  double local_380;
  double local_378;
  void *local_370;
  ulong local_368;
  Point<double> local_360;
  string local_348;
  string local_328;
  STL local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  double local_2b8;
  double dStack_2b0;
  string local_2a0;
  long *local_280 [2];
  long local_270 [2];
  CurrentState local_260;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_220;
  DistanceTree local_1f0;
  ImportedUgrid local_160;
  
  apuStack_450[0] = (undefined1 *)0x104477;
  launderArguments_abi_cxx11_(&local_2d0,argc,argv);
  apuStack_450[0] = (undefined1 *)0x10447f;
  bVar5 = isVersionRequested(&local_2d0);
  if (bVar5) {
    apuStack_450[0] = (undefined1 *)0x104ba5;
    printVersionAndExit();
    apuStack_450[0] = &LAB_00104bad;
    __clang_call_terminate(extraout_RAX);
  }
  apuStack_450[0] = (undefined1 *)0x10449c;
  getFilename(&local_3b0,&local_2d0);
  apuStack_450[0] = (undefined1 *)0x1044c8;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,local_3b0._M_dataplus._M_p,
             local_3b0._M_dataplus._M_p + local_3b0._M_string_length);
  apuStack_450[0] = (undefined1 *)0x1044e6;
  lVar6 = std::__cxx11::string::find((char *)local_280,0x10e27c,0);
  if (local_280[0] != local_270) {
    apuStack_450[0] = (undefined1 *)0x104501;
    operator_delete(local_280[0],local_270[0] + 1);
  }
  apuStack_450[0] = (undefined1 *)0x10452d;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,local_3b0._M_dataplus._M_p,
             local_3b0._M_dataplus._M_p + local_3b0._M_string_length);
  apuStack_450[0] = (undefined1 *)0x10454b;
  Parfait::ImportedUgridFactory::readUgrid(&local_160,&local_328,lVar6 != -1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    apuStack_450[0] = (undefined1 *)0x104568;
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  apuStack_450[0] = (undefined1 *)0x10457d;
  getWallTags((set<int,_std::less<int>,_std::allocator<int>_> *)&local_220,&local_160);
  apuStack_450[0] = (undefined1 *)0x10459a;
  cacheSurface(&local_308,&local_160,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_220);
  local_438.query_point.pos._M_elems[0] = 2e+21;
  local_438.query_point.pos._M_elems[1] = 2e+21;
  local_438.query_point.pos._M_elems[2] = 2e+21;
  local_438.surface_location.pos._M_elems[0] = -2e+21;
  local_438.surface_location.pos._M_elems[1] = -2e+21;
  local_438.surface_location.pos._M_elems[2]._0_1_ = 0x50;
  local_438.surface_location.pos._M_elems[2]._1_7_ = 0xc45b1ae4d6e2ef;
  for (pFVar7 = local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar7 != local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>
                ._M_impl.super__Vector_impl_data._M_finish; pFVar7 = pFVar7 + 1) {
    lVar6 = 3;
    do {
      puVar2 = *(undefined1 **)((long)((pFVar7->points)._M_elems + -1) + lVar6 * 8);
      puVar3 = (undefined1 *)(pFVar7->points)._M_elems[0].pos._M_elems[lVar6];
      puVar15 = (undefined1 *)local_438.query_point.pos._M_elems[lVar6];
      puVar14 = apuStack_450[lVar6];
      if ((double)puVar2 <= (double)apuStack_450[lVar6]) {
        puVar14 = puVar2;
      }
      if ((double)puVar3 <= (double)puVar14) {
        puVar14 = puVar3;
      }
      puVar4 = (undefined1 *)(&pFVar7->normal)[-2].pos._M_elems[lVar6];
      if ((double)puVar4 <= (double)puVar14) {
        puVar14 = puVar4;
      }
      apuStack_450[lVar6] = puVar14;
      if ((double)puVar15 <= (double)puVar2) {
        puVar15 = puVar2;
      }
      if ((double)puVar15 <= (double)puVar3) {
        puVar15 = puVar3;
      }
      if ((double)puVar15 <= (double)puVar4) {
        puVar15 = puVar4;
      }
      local_438.query_point.pos._M_elems[lVar6] = (double)puVar15;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
  }
  apuStack_450[0] = (undefined1 *)0x10463c;
  Parfait::DistanceTree::DistanceTree(&local_1f0,(Extent<double> *)&local_438);
  local_1f0.super_Octree<Parfait::Facet>.max_depth = 0x1a;
  if (local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar7 = local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      apuStack_450[0] = (undefined1 *)0x10466f;
      Parfait::Octree<Parfait::Facet>::insert(&local_1f0.super_Octree<Parfait::Facet>,pFVar7);
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != local_308.facets.
                       super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  apuStack_450[0] = (undefined1 *)0x104685;
  Parfait::Octree<Parfait::Facet>::finalize(&local_1f0.super_Octree<Parfait::Facet>);
  apuStack_450[0] = (undefined1 *)0x10468a;
  local_390 = std::chrono::_V2::system_clock::now();
  uVar10 = (ulong)((long)local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) / 3;
  uVar9 = (uint)uVar10;
  local_438.query_point.pos._M_elems[0] = -1.0;
  apuStack_450[0] = (undefined1 *)0x1046e3;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_3f0,(long)(int)uVar9,(value_type_conflict *)&local_438,
             (allocator_type *)&local_260);
  apuStack_450[0] = (undefined1 *)0x1046f3;
  printf("Searching for distance of %d points\n",uVar10 & 0xffffffff);
  local_440 = uVar10;
  if (0 < (int)uVar9) {
    local_440 = (ulong)(uVar9 & 0x7fffffff);
    uVar10 = 0;
    do {
      local_370 = (void *)local_160.nodes.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10 * 3];
      local_380 = local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10 * 3 + 1];
      local_378 = local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10 * 3 + 2];
      local_360.pos._M_elems[1] =
           local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 * 3 + 1];
      local_360.pos._M_elems[2] =
           local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 * 3 + 2];
      local_3d8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_438.query_point.pos._M_elems[0] = 1.79769313486232e+308;
      local_438.query_point.pos._M_elems[1] =
           (double)((ulong)local_438.query_point.pos._M_elems[1] & 0xffffffff00000000);
      apuStack_450[0] = (undefined1 *)0x1047dc;
      local_368 = uVar10;
      local_360.pos._M_elems[0] = (double)local_370;
      std::
      priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
      ::push(&local_3d8,(value_type *)&local_438);
      local_438.query_point.pos._M_elems[2] = local_360.pos._M_elems[2];
      local_438.query_point.pos._M_elems[0] = local_360.pos._M_elems[0];
      local_438.query_point.pos._M_elems[1] = local_360.pos._M_elems[1];
      local_438.surface_location.pos._M_elems[0] = 0.0;
      local_438.surface_location.pos._M_elems[1] = 0.0;
      local_438.surface_location.pos._M_elems[2]._0_1_ = 0;
      local_438.surface_location.pos._M_elems[2]._1_7_ = 0;
      local_438.actual_distance._0_1_ = 0xff;
      local_438.actual_distance._1_7_ = 0x7fefffffffffff;
      local_438.found_on_surface = false;
      do {
        if (local_3d8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_3d8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          uVar11 = (undefined4)
                   CONCAT71(local_438.surface_location.pos._M_elems[2]._1_7_,
                            local_438.surface_location.pos._M_elems[2]._0_1_);
          uVar12 = (undefined4)((uint7)local_438.surface_location.pos._M_elems[2]._1_7_ >> 0x18);
          dVar16 = local_438.surface_location.pos._M_elems[0];
          dVar17 = local_438.surface_location.pos._M_elems[1];
          if (local_3d8.c.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001048a3;
          goto LAB_001048d7;
        }
        apuStack_450[0] = (undefined1 *)0x104839;
        Parfait::DistanceTree::closestPoint(&local_260,&local_1f0,&local_360,&local_438,&local_3d8);
        local_438.query_point.pos._M_elems[0] = local_260.query_point.pos._M_elems[0];
        local_438.query_point.pos._M_elems[1] = local_260.query_point.pos._M_elems[1];
        local_438.query_point.pos._M_elems[2] = local_260.query_point.pos._M_elems[2];
        local_438.surface_location.pos._M_elems[0] = local_260.surface_location.pos._M_elems[0];
        local_438.surface_location.pos._M_elems[1] = local_260.surface_location.pos._M_elems[1];
        local_438.actual_distance._0_1_ = local_260.actual_distance._0_1_;
        local_438.actual_distance._1_7_ = local_260.actual_distance._1_7_;
        local_438.found_on_surface = local_260.found_on_surface;
        local_438.surface_location.pos._M_elems[2]._0_1_ =
             local_260.surface_location.pos._M_elems[2]._0_1_;
        local_438.surface_location.pos._M_elems[2]._1_7_ =
             local_260.surface_location.pos._M_elems[2]._1_7_;
      } while ((local_3d8.c.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first <
               (double)CONCAT71(local_438.actual_distance._1_7_,local_260.actual_distance._0_1_) ||
               (local_3d8.c.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first ==
               (double)CONCAT71(local_438.actual_distance._1_7_,local_260.actual_distance._0_1_));
      uVar11 = (undefined4)
               CONCAT71(local_260.surface_location.pos._M_elems[2]._1_7_,
                        local_260.surface_location.pos._M_elems[2]._0_1_);
      uVar12 = (undefined4)((uint7)local_260.surface_location.pos._M_elems[2]._1_7_ >> 0x18);
LAB_001048a3:
      local_388 = CONCAT44(uVar12,uVar11);
      apuStack_450[0] = (undefined1 *)0x1048c5;
      local_2b8 = local_438.surface_location.pos._M_elems[0];
      dStack_2b0 = local_438.surface_location.pos._M_elems[1];
      operator_delete(local_3d8.c.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.c.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.c.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar11 = (undefined4)local_388;
      uVar12 = (undefined4)((ulong)local_388 >> 0x20);
      dVar16 = local_2b8;
      dVar17 = dStack_2b0;
LAB_001048d7:
      dVar13 = local_378 - (double)CONCAT44(uVar12,uVar11);
      local_3f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[local_368] =
           SQRT(dVar13 * dVar13 +
                ((double)local_370 - dVar16) * ((double)local_370 - dVar16) +
                (local_380 - dVar17) * (local_380 - dVar17));
      uVar10 = local_368 + 1;
    } while (uVar10 != local_440);
  }
  apuStack_450[0] = (undefined1 *)0x10494f;
  std::chrono::_V2::system_clock::now();
  apuStack_450[0] = (undefined1 *)0x10496a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Elapsed time ",0xd);
  apuStack_450[0] = (undefined1 *)0x10499c;
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  apuStack_450[0] = (undefined1 *)0x1049b3;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  apuStack_450[0] = (undefined1 *)0x1049be;
  std::ostream::put((char)poVar8);
  apuStack_450[0] = (undefined1 *)0x1049c6;
  std::ostream::flush();
  apuStack_450[0] = (undefined1 *)0x1049ed;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"distance.txt","");
  apuStack_450[0] = (undefined1 *)0x104a0a;
  writeToFile(&local_2a0,&local_3f0,&local_160.nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    apuStack_450[0] = (undefined1 *)0x104a22;
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  apuStack_450[0] = (undefined1 *)0x104a49;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"boundary.txt","");
  apuStack_450[0] = (undefined1 *)0x104a5b;
  determineIfBoundaryNodes((vector<int,_std::allocator<int>_> *)&local_438,&local_160);
  apuStack_450[0] = (undefined1 *)0x104a75;
  writeBoundaryDistances(&local_348,&local_3f0,(vector<int,_std::allocator<int>_> *)&local_438);
  if ((void *)local_438.query_point.pos._M_elems[0] != (void *)0x0) {
    apuStack_450[0] = (undefined1 *)0x104a8a;
    operator_delete((void *)local_438.query_point.pos._M_elems[0],
                    (long)local_438.query_point.pos._M_elems[2] -
                    (long)local_438.query_point.pos._M_elems[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    apuStack_450[0] = (undefined1 *)0x104aa7;
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_3f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    apuStack_450[0] = (undefined1 *)0x104abe;
    operator_delete(local_3f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super_Octree<Parfait::Facet>.objects.
      super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    apuStack_450[0] = (undefined1 *)0x104adb;
    operator_delete(local_1f0.super_Octree<Parfait::Facet>.objects.
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super_Octree<Parfait::Facet>.objects.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super_Octree<Parfait::Facet>.objects.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  apuStack_450[0] = (undefined1 *)0x104aeb;
  std::
  vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  ::~vector(&local_1f0.super_Octree<Parfait::Facet>.voxels);
  if (local_1f0.super_Octree<Parfait::Facet>.should_split.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pfVar1 = &local_1f0.super_Octree<Parfait::Facet>.should_split;
    apuStack_450[0] = (undefined1 *)0x104b06;
    (*local_1f0.super_Octree<Parfait::Facet>.should_split.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_308.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start != (Facet *)0x0) {
    apuStack_450[0] = (undefined1 *)0x104b23;
    operator_delete(local_308.facets.
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.facets.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.facets.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.filename._M_dataplus._M_p != &local_308.filename.field_2) {
    apuStack_450[0] = (undefined1 *)0x104b44;
    operator_delete(local_308.filename._M_dataplus._M_p,
                    local_308.filename.field_2._M_allocated_capacity + 1);
  }
  apuStack_450[0] = (undefined1 *)0x104b51;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_220);
  apuStack_450[0] = (undefined1 *)0x104b5e;
  Parfait::ImportedUgrid::~ImportedUgrid(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    apuStack_450[0] = (undefined1 *)0x104b7f;
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  apuStack_450[0] = (undefined1 *)0x104b8c;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::vector<std::string> arguments = launderArguments(argc, argv);
    if(isVersionRequested(arguments))
        printVersionAndExit();

    std::string filename = getFilename(arguments);
    bool is_big_endian = isBigEndian(filename);

    auto ugrid = Parfait::ImportedUgridFactory::readUgrid(filename, is_big_endian);
    auto tags = getWallTags(ugrid);


    auto stl = cacheSurface(ugrid, tags);

    Parfait::DistanceTree tree(stl.findDomain());
    tree.setMaxDepth(26);

    for(const auto& f : stl.facets){
        tree.insert(f);
    }
    tree.finalize();

    auto start = std::chrono::system_clock::now();
    int nnodes = ugrid.nodes.size() / 3;
    std::vector<double> dist(nnodes, -1);
    printf("Searching for distance of %d points\n", nnodes);
#pragma omp parallel for schedule(guided)
    for(int n = 0; n < nnodes; n++){
        auto p = &ugrid.nodes[3*n+0];
        Parfait::Point<double> point(p[0], p[1], p[2]);
        auto c = tree.closestPoint(p);
        dist[n] = (point - c).magnitude();
    }
    auto end = std::chrono::system_clock::now();
    std::cout << "Elapsed time " << std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count() << std::endl;

    writeToFile("distance.txt", dist, ugrid.nodes);
    writeBoundaryDistances("boundary.txt", dist, determineIfBoundaryNodes(ugrid));
    //printf("Exporting <%s> as vtu.", filename.c_str());
    //Parfait::VtkUnstructuredWriter writer(filename, ugrid);
    //writer.addNodeData("distance", dist.data(), 1);
    //writer.writeBinary();
}